

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O1

Id __thiscall
anon_unknown.dwarf_deef1e::TGlslangToSpvTraverser::handleUserFunctionCall
          (TGlslangToSpvTraverser *this,TIntermAggregate *node)

{
  Builder *this_00;
  pointer pAVar1;
  Instruction *pIVar2;
  pointer pAVar3;
  TIntermAggregate *pTVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  Id IVar8;
  Decoration DVar9;
  undefined4 extraout_var;
  mapped_type *ppFVar10;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long *plVar11;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long lVar12;
  long lVar13;
  _Base_ptr p_Var14;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  TQualifier *pTVar15;
  _Base_ptr p_Var16;
  char *filename;
  long lVar17;
  _Base_ptr p_Var18;
  long lVar19;
  mapped_type function;
  vector<const_glslang::TType_*,_std::allocator<const_glslang::TType_*>_> argTypes;
  vector<unsigned_int,_std::allocator<unsigned_int>_> rValues;
  vector<spv::Builder::AccessChain,_std::allocator<spv::Builder::AccessChain>_> lValues;
  vector<unsigned_int,_std::allocator<unsigned_int>_> spvArgs;
  Id local_258;
  Id local_254;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_250;
  long local_248;
  mapped_type local_240;
  long local_238;
  _Base_ptr local_230;
  void *local_228;
  long lStack_220;
  long local_218;
  Id *local_208;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_200;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_1f8;
  Id local_1ec;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1e8;
  TIntermAggregate *local_1c8;
  long local_1c0;
  vector<spv::Builder::AccessChain,_std::allocator<spv::Builder::AccessChain>_> local_1b8;
  undefined1 local_198 [32];
  Id local_178;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_170;
  undefined8 local_158;
  undefined8 uStack_150;
  CoherentFlags local_148 [4];
  Id local_138;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_130;
  Id local_118;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_110;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined2 local_e8;
  Id local_e0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_d8;
  Id local_c0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined2 local_90;
  Id local_88;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_80;
  Id local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined2 local_38;
  
  iVar6 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x35])(node);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_198,*(char **)(CONCAT44(extraout_var,iVar6) + 8),
             (allocator<char> *)&local_1b8);
  ppFVar10 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spv::Function_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spv::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spv::Function_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spv::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->functionMap,(key_type *)local_198);
  local_240 = *ppFVar10;
  if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
    operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
  }
  if (local_240 == (mapped_type)0x0) {
    IVar8 = 0;
  }
  else {
    iVar6 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x33])(node);
    lVar19 = CONCAT44(extraout_var_00,iVar6);
    local_1c8 = node;
    iVar6 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x39])(node);
    local_248 = CONCAT44(extraout_var_01,iVar6);
    local_1b8.
    super__Vector_base<spv::Builder::AccessChain,_std::allocator<spv::Builder::AccessChain>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1b8.
    super__Vector_base<spv::Builder::AccessChain,_std::allocator<spv::Builder::AccessChain>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1b8.
    super__Vector_base<spv::Builder::AccessChain,_std::allocator<spv::Builder::AccessChain>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
    local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (uint *)0x0;
    local_218 = 0;
    local_228 = (void *)0x0;
    lStack_220 = 0;
    lVar12 = *(long *)(lVar19 + 8);
    local_238 = lVar19;
    if (0 < (int)((ulong)(*(long *)(lVar19 + 0x10) - lVar12) >> 3)) {
      local_250 = &(this->builder).accessChain.swizzle;
      lVar19 = 0;
      do {
        lVar17 = local_238;
        plVar11 = (long *)(**(code **)(**(long **)(lVar12 + lVar19 * 8) + 0x18))();
        local_198._0_8_ = (**(code **)(*plVar11 + 0xf0))(plVar11);
        std::vector<glslang::TType_const*,std::allocator<glslang::TType_const*>>::
        emplace_back<glslang::TType_const*>
                  ((vector<glslang::TType_const*,std::allocator<glslang::TType_const*>> *)&local_228
                   ,(TType **)local_198);
        spv::Builder::clearAccessChain(&this->builder);
        plVar11 = *(long **)(*(long *)(lVar17 + 8) + lVar19 * 8);
        (**(code **)(*plVar11 + 0x10))(plVar11,this);
        bVar5 = originalParam(this,*(TStorageQualifier *)(*(long *)(local_248 + 8) + lVar19 * 4),
                              *(TType **)((long)local_228 + lVar19 * 8),
                              (bool)(lVar19 == 0 & local_240->implicitThis));
        if ((bVar5) || (iVar6 = *(int *)(*(long *)(local_248 + 8) + lVar19 * 4), iVar6 - 0x10U < 3))
        {
          local_198._0_4_ = (this->builder).accessChain.base;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_198 + 8),
                     &(this->builder).accessChain.indexChain);
          local_178 = (this->builder).accessChain.instr;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_170,local_250);
          local_148[0]._0_2_ = *(undefined2 *)&(this->builder).accessChain.coherentFlags;
          local_158._0_4_ = (this->builder).accessChain.component;
          local_158._4_4_ = (this->builder).accessChain.preSwizzleBaseType;
          uStack_150._0_1_ = (this->builder).accessChain.isRValue;
          uStack_150._1_3_ = *(undefined3 *)&(this->builder).accessChain.field_0x49;
          uStack_150._4_4_ = (this->builder).accessChain.alignment;
          std::vector<spv::Builder::AccessChain,_std::allocator<spv::Builder::AccessChain>_>::
          emplace_back<spv::Builder::AccessChain>(&local_1b8,(AccessChain *)local_198);
          if (local_170.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_170.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_170.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_170.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if ((uint *)local_198._8_8_ != (uint *)0x0) {
            operator_delete((void *)local_198._8_8_,local_198._24_8_ - local_198._8_8_);
          }
        }
        else {
          if ((iVar6 != 5) && (iVar6 != 0x13)) goto LAB_003c5fef;
          IVar8 = accessChainLoad(this,*(TType **)(lStack_220 + -8));
          local_198._0_4_ = IVar8;
          if (local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_1e8,
                       (iterator)
                       local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)local_198);
          }
          else {
            *local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = IVar8;
            local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
        lVar19 = lVar19 + 1;
        lVar12 = *(long *)(local_238 + 8);
      } while (lVar19 < (int)((ulong)(*(long *)(local_238 + 0x10) - lVar12) >> 3));
    }
    pTVar4 = local_1c8;
    this_00 = &this->builder;
    iVar6 = (**(local_1c8->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
               _vptr_TIntermNode)(local_1c8);
    iVar6 = *(int *)(CONCAT44(extraout_var_02,iVar6) + 0xc);
    iVar7 = (**(pTVar4->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
               _vptr_TIntermNode)(pTVar4);
    lVar19 = local_238;
    lVar12 = local_248;
    if (*(long *)CONCAT44(extraout_var_03,iVar7) == 0) {
      filename = (char *)0x0;
    }
    else {
      filename = *(char **)(*(long *)CONCAT44(extraout_var_03,iVar7) + 8);
    }
    spv::Builder::setDebugSourceLocation(this_00,iVar6,filename);
    local_198._0_8_ = (pointer)0x0;
    local_198._8_8_ = (uint *)0x0;
    local_198._16_8_ = (uint *)0x0;
    function = local_240;
    if (0 < (int)((ulong)(*(long *)(lVar19 + 0x10) - *(long *)(lVar19 + 8)) >> 3)) {
      p_Var18 = &(local_240->reducedPrecisionParams)._M_t._M_impl.super__Rb_tree_header._M_header;
      local_1f8 = &(this->builder).accessChain.indexChain;
      local_200 = &(this->builder).accessChain.swizzle;
      local_208 = &(this->builder).accessChain.component;
      lVar17 = 0;
      local_250 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                  ((ulong)local_250 & 0xffffffff00000000);
      local_254 = 0;
      local_230 = p_Var18;
      do {
        bVar5 = originalParam(this,*(TStorageQualifier *)(*(long *)(lVar12 + 8) + lVar17 * 4),
                              *(TType **)((long)local_228 + lVar17 * 8),
                              (bool)(lVar17 == 0 & function->implicitThis));
        pAVar3 = local_1b8.
                 super__Vector_base<spv::Builder::AccessChain,_std::allocator<spv::Builder::AccessChain>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (bVar5) {
          lVar12 = (long)(int)local_250;
          pAVar1 = local_1b8.
                   super__Vector_base<spv::Builder::AccessChain,_std::allocator<spv::Builder::AccessChain>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar12;
          local_88 = pAVar1->base;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (&local_80,&pAVar1->indexChain);
          local_68 = pAVar1->instr;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (&local_60,&pAVar3[lVar12].swizzle);
          local_38 = *(undefined2 *)&pAVar3[lVar12].coherentFlags;
          local_48._0_4_ = pAVar3[lVar12].component;
          local_48._4_4_ = pAVar3[lVar12].preSwizzleBaseType;
          pAVar3 = pAVar3 + lVar12;
          uStack_40._0_1_ = pAVar3->isRValue;
          uStack_40._1_3_ = *(undefined3 *)&pAVar3->field_0x49;
          uStack_40._4_4_ = pAVar3->alignment;
          (this->builder).accessChain.base = local_88;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(local_1f8,&local_80);
          (this->builder).accessChain.instr = local_68;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(local_200,&local_60);
          *(undefined2 *)(local_208 + 4) = local_38;
          *(undefined8 *)local_208 = local_48;
          *(undefined8 *)(local_208 + 2) = uStack_40;
          if (local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_60.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_60.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_80.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_80.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          local_258 = spv::Builder::accessChainGetLValue(this_00);
          local_250 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      CONCAT44(local_250._4_4_,(int)local_250 + 1);
          p_Var18 = local_230;
          lVar12 = local_248;
          function = local_240;
          lVar19 = local_238;
        }
        else {
          iVar6 = *(int *)(*(long *)(lVar12 + 8) + lVar17 * 4);
          if (iVar6 - 0x10U < 3) {
            p_Var14 = p_Var18;
            for (p_Var16 = (function->reducedPrecisionParams)._M_t._M_impl.super__Rb_tree_header.
                           _M_header._M_parent; p_Var16 != (_Base_ptr)0x0;
                p_Var16 = (&p_Var16->_M_left)[(int)p_Var16[1]._M_color < lVar17]) {
              if (lVar17 <= (int)p_Var16[1]._M_color) {
                p_Var14 = p_Var16;
              }
            }
            p_Var16 = p_Var18;
            if ((p_Var14 != p_Var18) && (p_Var16 = p_Var14, lVar17 < (int)p_Var14[1]._M_color)) {
              p_Var16 = p_Var18;
            }
            DVar9 = DecorationRelaxedPrecision;
            if (p_Var16 == p_Var18) {
              DVar9 = DecorationMax;
            }
            IVar8 = spv::Builder::getContainedTypeId
                              (this_00,(local_240->parameterInstructions).
                                       super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start[lVar17]->typeId);
            local_258 = spv::Builder::createVariable(this_00,DVar9,Function,IVar8,"param",0,true);
            pAVar3 = local_1b8.
                     super__Vector_base<spv::Builder::AccessChain,_std::allocator<spv::Builder::AccessChain>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((*(uint *)(*(long *)(lVar12 + 8) + lVar17 * 4) | 2) == 0x12) {
              lVar12 = (long)(int)local_250;
              pAVar1 = local_1b8.
                       super__Vector_base<spv::Builder::AccessChain,_std::allocator<spv::Builder::AccessChain>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar12;
              local_e0 = pAVar1->base;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                        (&local_d8,&pAVar1->indexChain);
              local_c0 = pAVar1->instr;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                        (&local_b8,&pAVar3[lVar12].swizzle);
              local_90 = *(undefined2 *)&pAVar3[lVar12].coherentFlags;
              local_a0._0_4_ = pAVar3[lVar12].component;
              local_a0._4_4_ = pAVar3[lVar12].preSwizzleBaseType;
              pAVar3 = pAVar3 + lVar12;
              uStack_98._0_1_ = pAVar3->isRValue;
              uStack_98._1_3_ = *(undefined3 *)&pAVar3->field_0x49;
              uStack_98._4_4_ = pAVar3->alignment;
              (this->builder).accessChain.base = local_e0;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                        (local_1f8,&local_d8);
              (this->builder).accessChain.instr = local_c0;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                        (local_200,&local_b8);
              *(undefined2 *)(local_208 + 4) = local_90;
              *(undefined8 *)local_208 = local_a0;
              *(undefined8 *)(local_208 + 2) = uStack_98;
              if (local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_b8.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_b8.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_b8.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_d8.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_d8.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_d8.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              IVar8 = accessChainLoad(this,*(TType **)((long)local_228 + lVar17 * 8));
              spv::Builder::clearAccessChain(this_00);
              spv::Builder::setAccessChainLValue(this_00,local_258);
              multiTypeStore(this,*(TType **)((long)local_228 + lVar17 * 8),IVar8);
              lVar12 = local_248;
              lVar19 = local_238;
            }
            local_250 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        CONCAT44(local_250._4_4_,(int)local_250 + 1);
            p_Var18 = local_230;
            function = local_240;
          }
          else {
            if ((iVar6 != 5) && (iVar6 != 0x13)) goto LAB_003c5fef;
            local_1c0 = (long)(int)local_254;
            pIVar2 = (this->builder).module.idToInstruction.
                     super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                     _M_impl.super__Vector_impl_data._M_start
                     [local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start[local_1c0]];
            if (pIVar2 == (Instruction *)0x0) {
              IVar8 = 0;
            }
            else {
              IVar8 = pIVar2->typeId;
            }
            if ((function->parameterInstructions).
                super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
                super__Vector_impl_data._M_start[lVar17]->typeId == IVar8) {
              lVar13 = (**(code **)(**(long **)((long)local_228 + lVar17 * 8) + 0x58))();
              p_Var14 = p_Var18;
              for (p_Var16 = (function->reducedPrecisionParams)._M_t._M_impl.super__Rb_tree_header.
                             _M_header._M_parent; p_Var16 != (_Base_ptr)0x0;
                  p_Var16 = (&p_Var16->_M_left)[(int)p_Var16[1]._M_color < lVar17]) {
                if (lVar17 <= (int)p_Var16[1]._M_color) {
                  p_Var14 = p_Var16;
                }
              }
              p_Var16 = p_Var18;
              if ((p_Var14 != p_Var18) && (p_Var16 = p_Var14, lVar17 < (int)p_Var14[1]._M_color)) {
                p_Var16 = p_Var18;
              }
              if ((p_Var16 == p_Var18) == (*(uint *)(lVar13 + 8) >> 0x19 & 7) - 1 < 2)
              goto LAB_003c5bd4;
              local_258 = local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start[local_1c0];
            }
            else {
LAB_003c5bd4:
              p_Var14 = p_Var18;
              for (p_Var16 = (function->reducedPrecisionParams)._M_t._M_impl.super__Rb_tree_header.
                             _M_header._M_parent; p_Var16 != (_Base_ptr)0x0;
                  p_Var16 = (&p_Var16->_M_left)[(int)p_Var16[1]._M_color < lVar17]) {
                if (lVar17 <= (int)p_Var16[1]._M_color) {
                  p_Var14 = p_Var16;
                }
              }
              p_Var16 = p_Var18;
              if ((p_Var14 != p_Var18) && (p_Var16 = p_Var14, lVar17 < (int)p_Var14[1]._M_color)) {
                p_Var16 = p_Var18;
              }
              DVar9 = DecorationRelaxedPrecision;
              if (p_Var16 == p_Var18) {
                DVar9 = DecorationMax;
              }
              IVar8 = spv::Builder::createVariable
                                (this_00,DVar9,Function,
                                 (function->parameterInstructions).
                                 super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar17]->typeId,"arg",0,
                                 true);
              spv::Builder::clearAccessChain(this_00);
              p_Var18 = local_230;
              local_1ec = IVar8;
              spv::Builder::setAccessChainLValue(this_00,IVar8);
              multiTypeStore(this,*(TType **)((long)local_228 + lVar17 * 8),
                             local_1e8.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[local_1c0]);
              lVar12 = local_248;
              p_Var14 = p_Var18;
              for (p_Var16 = (function->reducedPrecisionParams)._M_t._M_impl.super__Rb_tree_header.
                             _M_header._M_parent; p_Var16 != (_Base_ptr)0x0;
                  p_Var16 = (&p_Var16->_M_left)[(int)p_Var16[1]._M_color < lVar17]) {
                if (lVar17 <= (int)p_Var16[1]._M_color) {
                  p_Var14 = p_Var16;
                }
              }
              p_Var16 = p_Var18;
              if ((p_Var14 != p_Var18) && (p_Var16 = p_Var14, lVar17 < (int)p_Var14[1]._M_color)) {
                p_Var16 = p_Var18;
              }
              DVar9 = DecorationRelaxedPrecision;
              if (p_Var16 == p_Var18) {
                DVar9 = DecorationMax;
              }
              local_258 = spv::Builder::createLoad(this_00,local_1ec,DVar9,MaskNone,Max,0);
              function = local_240;
            }
            local_254 = local_254 + 1;
          }
        }
        if (local_198._8_8_ == local_198._16_8_) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_198,
                     (iterator)local_198._8_8_,&local_258);
        }
        else {
          *(Id *)local_198._8_8_ = local_258;
          local_198._8_8_ = local_198._8_8_ + 4;
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 < (int)((ulong)(*(long *)(lVar19 + 0x10) - *(long *)(lVar19 + 8)) >> 3));
    }
    IVar8 = spv::Builder::createFunctionCall
                      (this_00,function,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_198);
    pTVar4 = local_1c8;
    iVar6 = (*(local_1c8->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x1e])(local_1c8);
    lVar17 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar6) + 0x58))
                       ((long *)CONCAT44(extraout_var_04,iVar6));
    if ((IVar8 != 0) && ((*(uint *)(lVar17 + 8) >> 0x19 & 7) - 1 < 2)) {
      spv::Builder::addDecoration(this_00,IVar8,DecorationRelaxedPrecision,-1);
    }
    iVar6 = (*(pTVar4->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x1e])(pTVar4);
    pTVar15 = (TQualifier *)
              (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar6) + 0x58))
                        ((long *)CONCAT44(extraout_var_05,iVar6));
    DVar9 = TranslateNonUniformDecoration(this,pTVar15);
    local_254 = IVar8;
    spv::Builder::addDecoration(this_00,IVar8,DVar9,-1);
    if (0 < (int)((ulong)(*(long *)(lVar19 + 0x10) - *(long *)(lVar19 + 8)) >> 3)) {
      local_1f8 = &(this->builder).accessChain.indexChain;
      local_200 = &(this->builder).accessChain.swizzle;
      local_208 = &(this->builder).accessChain.component;
      lVar17 = 0;
      iVar6 = 0;
      do {
        bVar5 = originalParam(this,*(TStorageQualifier *)(*(long *)(lVar12 + 8) + lVar17 * 4),
                              *(TType **)((long)local_228 + lVar17 * 8),
                              (bool)(lVar17 == 0 & function->implicitThis));
        if (bVar5) {
LAB_003c5fcb:
          iVar6 = iVar6 + 1;
        }
        else {
          iVar7 = *(int *)(*(long *)(lVar12 + 8) + lVar17 * 4);
          if (iVar7 < 0x11) {
            if (iVar7 != 5) {
              if (iVar7 == 0x10) goto LAB_003c5fcb;
LAB_003c5fef:
              __assert_fail("qualifier == glslang::EvqIn || qualifier == glslang::EvqOut || qualifier == glslang::EvqInOut || qualifier == glslang::EvqUniform || qualifier == glslang::EvqConstReadOnly"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                            ,0x1778,
                            "bool (anonymous namespace)::TGlslangToSpvTraverser::writableParam(glslang::TStorageQualifier) const"
                           );
            }
          }
          else {
            if (iVar7 - 0x11U < 2) {
              IVar8 = spv::Builder::createLoad
                                (this_00,*(Id *)(local_198._0_8_ + lVar17 * 4),DecorationMax,
                                 MaskNone,Max,0);
              pTVar15 = (TQualifier *)
                        (**(code **)(**(long **)((long)local_228 + lVar17 * 8) + 0x58))();
              DVar9 = TranslateNonUniformDecoration(this,pTVar15);
              local_230 = (_Base_ptr)CONCAT44(local_230._4_4_,IVar8);
              spv::Builder::addDecoration(this_00,IVar8,DVar9,-1);
              pAVar1 = local_1b8.
                       super__Vector_base<spv::Builder::AccessChain,_std::allocator<spv::Builder::AccessChain>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_250 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          CONCAT44(local_250._4_4_,iVar6);
              pAVar3 = local_1b8.
                       super__Vector_base<spv::Builder::AccessChain,_std::allocator<spv::Builder::AccessChain>_>
                       ._M_impl.super__Vector_impl_data._M_start + iVar6;
              local_138 = pAVar3->base;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                        (&local_130,&pAVar3->indexChain);
              local_118 = pAVar3->instr;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                        (&local_110,&pAVar1[iVar6].swizzle);
              local_e8 = *(undefined2 *)&pAVar1[iVar6].coherentFlags;
              local_f8._0_4_ = pAVar1[iVar6].component;
              local_f8._4_4_ = pAVar1[iVar6].preSwizzleBaseType;
              pAVar1 = pAVar1 + iVar6;
              uStack_f0._0_1_ = pAVar1->isRValue;
              uStack_f0._1_3_ = *(undefined3 *)&pAVar1->field_0x49;
              uStack_f0._4_4_ = pAVar1->alignment;
              (this->builder).accessChain.base = local_138;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                        (local_1f8,&local_130);
              (this->builder).accessChain.instr = local_118;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                        (local_200,&local_110);
              *(undefined2 *)(local_208 + 4) = local_e8;
              *(undefined8 *)local_208 = local_f8;
              *(undefined8 *)(local_208 + 2) = uStack_f0;
              if (local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_110.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_110.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_110.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              lVar19 = local_238;
              function = local_240;
              if (local_130.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_130.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_130.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_130.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              multiTypeStore(this,*(TType **)((long)local_228 + lVar17 * 8),(Id)local_230);
              lVar12 = local_248;
              iVar6 = (int)local_250;
              goto LAB_003c5fcb;
            }
            if (iVar7 != 0x13) goto LAB_003c5fef;
          }
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 < (int)((ulong)(*(long *)(lVar19 + 0x10) - *(long *)(lVar19 + 8)) >> 3));
    }
    if ((pointer)local_198._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_198._0_8_,local_198._16_8_ - local_198._0_8_);
    }
    if (local_228 != (void *)0x0) {
      operator_delete(local_228,local_218 - (long)local_228);
    }
    IVar8 = local_254;
    if (local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1e8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1e8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::vector<spv::Builder::AccessChain,_std::allocator<spv::Builder::AccessChain>_>::~vector
              (&local_1b8);
  }
  return IVar8;
}

Assistant:

spv::Id TGlslangToSpvTraverser::handleUserFunctionCall(const glslang::TIntermAggregate* node)
{
    // Grab the function's pointer from the previously created function
    spv::Function* function = functionMap[node->getName().c_str()];
    if (! function)
        return 0;

    const glslang::TIntermSequence& glslangArgs = node->getSequence();
    const glslang::TQualifierList& qualifiers = node->getQualifierList();

    //  See comments in makeFunctions() for details about the semantics for parameter passing.
    //
    // These imply we need a four step process:
    // 1. Evaluate the arguments
    // 2. Allocate and make copies of in, out, and inout arguments
    // 3. Make the call
    // 4. Copy back the results

    // 1. Evaluate the arguments and their types
    std::vector<spv::Builder::AccessChain> lValues;
    std::vector<spv::Id> rValues;
    std::vector<const glslang::TType*> argTypes;
    for (int a = 0; a < (int)glslangArgs.size(); ++a) {
        argTypes.push_back(&glslangArgs[a]->getAsTyped()->getType());
        // build l-value
        builder.clearAccessChain();
        glslangArgs[a]->traverse(this);
        // keep outputs and pass-by-originals as l-values, evaluate others as r-values
        if (originalParam(qualifiers[a], *argTypes[a], function->hasImplicitThis() && a == 0) ||
            writableParam(qualifiers[a])) {
            // save l-value
            lValues.push_back(builder.getAccessChain());
        } else {
            // process r-value
            rValues.push_back(accessChainLoad(*argTypes.back()));
        }
    }

    // Reset source location to the function call location after argument evaluation
    builder.setDebugSourceLocation(node->getLoc().line, node->getLoc().getFilename());

    // 2. Allocate space for anything needing a copy, and if it's "in" or "inout"
    // copy the original into that space.
    //
    // Also, build up the list of actual arguments to pass in for the call
    int lValueCount = 0;
    int rValueCount = 0;
    std::vector<spv::Id> spvArgs;
    for (int a = 0; a < (int)glslangArgs.size(); ++a) {
        spv::Id arg;
        if (originalParam(qualifiers[a], *argTypes[a], function->hasImplicitThis() && a == 0)) {
            builder.setAccessChain(lValues[lValueCount]);
            arg = builder.accessChainGetLValue();
            ++lValueCount;
        } else if (writableParam(qualifiers[a])) {
            // need space to hold the copy
            arg = builder.createVariable(function->getParamPrecision(a), spv::StorageClassFunction,
                builder.getContainedTypeId(function->getParamType(a)), "param");
            if (qualifiers[a] == glslang::EvqIn || qualifiers[a] == glslang::EvqInOut) {
                // need to copy the input into output space
                builder.setAccessChain(lValues[lValueCount]);
                spv::Id copy = accessChainLoad(*argTypes[a]);
                builder.clearAccessChain();
                builder.setAccessChainLValue(arg);
                multiTypeStore(*argTypes[a], copy);
            }
            ++lValueCount;
        } else {
            // process r-value, which involves a copy for a type mismatch
            if (function->getParamType(a) != builder.getTypeId(rValues[rValueCount]) ||
                TranslatePrecisionDecoration(*argTypes[a]) != function->getParamPrecision(a))
            {
                spv::Id argCopy = builder.createVariable(function->getParamPrecision(a), spv::StorageClassFunction, function->getParamType(a), "arg");
                builder.clearAccessChain();
                builder.setAccessChainLValue(argCopy);
                multiTypeStore(*argTypes[a], rValues[rValueCount]);
                arg = builder.createLoad(argCopy, function->getParamPrecision(a));
            } else
                arg = rValues[rValueCount];
            ++rValueCount;
        }
        spvArgs.push_back(arg);
    }

    // 3. Make the call.
    spv::Id result = builder.createFunctionCall(function, spvArgs);
    builder.setPrecision(result, TranslatePrecisionDecoration(node->getType()));
    builder.addDecoration(result, TranslateNonUniformDecoration(node->getType().getQualifier()));

    // 4. Copy back out an "out" arguments.
    lValueCount = 0;
    for (int a = 0; a < (int)glslangArgs.size(); ++a) {
        if (originalParam(qualifiers[a], *argTypes[a], function->hasImplicitThis() && a == 0))
            ++lValueCount;
        else if (writableParam(qualifiers[a])) {
            if (qualifiers[a] == glslang::EvqOut || qualifiers[a] == glslang::EvqInOut) {
                spv::Id copy = builder.createLoad(spvArgs[a], spv::NoPrecision);
                builder.addDecoration(copy, TranslateNonUniformDecoration(argTypes[a]->getQualifier()));
                builder.setAccessChain(lValues[lValueCount]);
                multiTypeStore(*argTypes[a], copy);
            }
            ++lValueCount;
        }
    }

    return result;
}